

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnThrowExpr(BinaryReaderIR *this,Index except_index)

{
  Var *this_00;
  char *__s;
  Offset OVar1;
  Result RVar2;
  undefined1 local_a8 [8];
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_40;
  Expr *local_38;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.field_1.field_0.line = 0;
  loc.filename.data_ = (char *)strlen(__s);
  this_00 = (Var *)((long)&loc.field_1 + 8);
  local_a8 = (undefined1  [8])__s;
  loc.filename.size_ = OVar1;
  Var::Var(this_00,except_index,(Location *)local_a8);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)45>,wabt::Var>((wabt *)&local_38,this_00);
  local_40._M_head_impl = local_38;
  local_38 = (Expr *)0x0;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_40);
  if (local_40._M_head_impl != (Expr *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_38 != (Expr *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  local_38 = (Expr *)0x0;
  Var::~Var((Var *)((long)&loc.field_1 + 8));
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnThrowExpr(Index except_index) {
  return AppendExpr(MakeUnique<ThrowExpr>(Var(except_index, GetLocation())));
}